

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

unqlite_kv_methods * unqliteFindKVStore(char *zName,sxu32 nByte)

{
  unqlite_kv_methods *puVar1;
  char *zLeft;
  void *pvVar2;
  char *pcVar3;
  sxi32 sVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  
  pvVar2 = sUnqlMPGlobal.kv_storage.pBase;
  uVar7 = (ulong)sUnqlMPGlobal.kv_storage.nUsed;
  if (uVar7 != 0) {
    uVar6 = 0;
    do {
      puVar1 = *(unqlite_kv_methods **)((long)pvVar2 + uVar6 * 8);
      zLeft = puVar1->zName;
      pcVar5 = zLeft;
      if (*zLeft != '\0') {
        pcVar3 = zLeft + 2;
        do {
          pcVar5 = pcVar3;
          if (pcVar5[-1] == '\0') {
            pcVar5 = pcVar5 + -1;
            goto LAB_00115110;
          }
          if (*pcVar5 == '\0') goto LAB_00115110;
          if (pcVar5[1] == '\0') {
            pcVar5 = pcVar5 + 1;
            goto LAB_00115110;
          }
          pcVar3 = pcVar5 + 4;
        } while (pcVar5[2] != '\0');
        pcVar5 = pcVar5 + 2;
      }
LAB_00115110:
      if (((int)pcVar5 - (int)zLeft == nByte) && (sVar4 = SyStrnicmp(zLeft,zName,nByte), sVar4 == 0)
         ) {
        return puVar1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar7);
  }
  return (unqlite_kv_methods *)0x0;
}

Assistant:

UNQLITE_PRIVATE unqlite_kv_methods * unqliteFindKVStore(
	const char *zName, /* Storage engine name [i.e. Hash, B+tree, LSM, etc.] */
	sxu32 nByte /* zName length */
	)
{
	unqlite_kv_methods **apStore,*pEntry;
	sxu32 n,nMax;
	/* Point to the set of installed engines */
	apStore = (unqlite_kv_methods **)SySetBasePtr(&sUnqlMPGlobal.kv_storage);
	nMax = SySetUsed(&sUnqlMPGlobal.kv_storage);
	for( n = 0 ; n < nMax; ++n ){
		pEntry = apStore[n];
		if( nByte == SyStrlen(pEntry->zName) && SyStrnicmp(pEntry->zName,zName,nByte) == 0 ){
			/* Storage engine found */
			return pEntry;
		}
	}
	/* No such entry, return NULL */
	return 0;
}